

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O3

sx_job_t sx_job_dispatch(sx_job_context *ctx,int count,sx_job_cb *callback,void *user,
                        sx_job_priority priority,uint tags)

{
  sx_lock_t sVar1;
  int iVar2;
  sx_pool *psVar3;
  sx__pool_page *psVar4;
  bool bVar5;
  code *pcVar6;
  _Bool _Var7;
  int iVar8;
  int range_end;
  uint uVar9;
  sx_job_t puVar10;
  long *plVar11;
  sx__pool_page *psVar12;
  long lVar13;
  sx__pool_page *psVar14;
  sx__job *psVar15;
  undefined4 *puVar16;
  sx_fiber_t pvVar17;
  uint32_t uVar18;
  char *pcVar19;
  uint uVar20;
  undefined8 extraout_RDX;
  long lVar21;
  size_t sVar22;
  void ***__s;
  sx_job_priority *psVar23;
  void *pvVar24;
  char *sourcefile;
  uint32_t uVar25;
  uint32_t uVar26;
  int range_start;
  sx__job_pending *psVar27;
  ulong uVar28;
  sx_fiber_stack stack;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uStack_7c;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t uStack_70;
  uint32_t local_64;
  
  if (count < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x11f,"count > 0");
    pcVar6 = (code *)swi(3);
    puVar10 = (sx_job_t)(*pcVar6)();
    return puVar10;
  }
  plVar11 = (long *)sx_tls_get(ctx->thread_tls);
  uVar9 = ctx->num_threads;
  if (tags == 0) {
    uVar18 = uVar9 + 1;
  }
  else if ((int)uVar9 < 0) {
    uVar18 = 0;
  }
  else {
    lVar21 = 0;
    uVar18 = 0;
    do {
      uVar18 = (uVar18 + 1) - (uint)((ctx->tags[lVar21] & tags) == 0);
      lVar21 = lVar21 + 1;
    } while ((ulong)uVar9 + 1 != lVar21);
  }
  iVar8 = count / (int)uVar18;
  local_64 = count % (int)uVar18;
  uVar25 = 0;
  if (0 < (int)local_64) {
    uVar25 = local_64;
  }
  if (0 < iVar8) {
    uVar25 = uVar18;
  }
  if ((int)uVar25 < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x132,"num_jobs > 0");
    pcVar6 = (code *)swi(3);
    puVar10 = (sx_job_t)(*pcVar6)();
    return puVar10;
  }
  if (ctx->job_pool->capacity < (int)uVar25) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x134,"this amount of jobs at a time cannot be done. increase max_jobs");
    pcVar6 = (code *)swi(3);
    puVar10 = (sx_job_t)(*pcVar6)();
    return puVar10;
  }
  while( true ) {
    LOCK();
    sVar1 = ctx->counter_lk;
    ctx->counter_lk = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (ctx->counter_lk != 0);
  }
  psVar3 = ctx->counter_pool;
  for (psVar12 = psVar3->pages; psVar12 != (sx__pool_page *)0x0; psVar12 = psVar12->next) {
    if (0 < psVar12->iter) goto LAB_0010a85e;
  }
  iVar2 = psVar3->item_sz;
  uVar9 = psVar3->capacity;
  uVar28 = (ulong)uVar9;
  lVar21 = (long)(int)uVar9;
  psVar12 = (sx__pool_page *)
            (*ctx->alloc->alloc_cb)
                      ((void *)0x0,((long)iVar2 + 8) * lVar21 + 0x20,0x10,
                       "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                       "sx_job_t sx_job_dispatch(sx_job_context *, int, sx_job_cb *, void *, sx_job_priority, unsigned int)"
                       ,0x139,ctx->alloc->user_data);
  if (psVar12 == (sx__pool_page *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",
               0x3e);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0x3e,"Out of memory");
    pcVar6 = (code *)swi(3);
    puVar10 = (sx_job_t)(*pcVar6)();
    return puVar10;
  }
  psVar12->iter = uVar9;
  psVar12->ptrs = &psVar12[1].ptrs;
  __s = &psVar12[1].ptrs + lVar21;
  psVar12->buff = (uint8_t *)__s;
  psVar12->next = (sx__pool_page *)0x0;
  if (0 < (int)uVar9) {
    lVar13 = 0;
    do {
      lVar21 = lVar21 + -1;
      psVar12->ptrs[lVar21] = psVar12->buff + lVar13;
      lVar13 = lVar13 + iVar2;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
    __s = (void ***)psVar12->buff;
  }
  memset(__s,0,(long)(int)(uVar9 * iVar2));
  psVar4 = psVar3->pages;
  do {
    psVar14 = psVar4;
    psVar4 = psVar14->next;
  } while (psVar4 != (sx__pool_page *)0x0);
  psVar14->next = psVar12;
LAB_0010a85e:
  psVar12 = ctx->counter_pool->pages;
  while (iVar2 = psVar12->iter, iVar2 == 0) {
    psVar12 = psVar12->next;
    if (psVar12 == (sx__pool_page *)0x0) {
LAB_0010a8eb:
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0x8f,"capacity is full");
      pcVar6 = (code *)swi(3);
      puVar10 = (sx_job_t)(*pcVar6)();
      return puVar10;
    }
  }
  if (iVar2 < 1) goto LAB_0010a8eb;
  psVar12->iter = iVar2 - 1U;
  puVar10 = (sx_job_t)psVar12->ptrs[iVar2 - 1U];
  ctx->counter_lk = 0;
  if (puVar10 == (sx_job_t)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x13d,"Maximum job instances exceeded");
    pcVar6 = (code *)swi(3);
    puVar10 = (sx_job_t)(*pcVar6)();
    return puVar10;
  }
  *puVar10 = uVar25;
  if (plVar11 == (long *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x142,"Dispatch must be called within main thread or job threads");
    pcVar6 = (code *)swi(3);
    puVar10 = (sx_job_t)(*pcVar6)();
    return puVar10;
  }
  if (*plVar11 != 0) {
    *(sx_job_t *)(*plVar11 + 0x38) = puVar10;
  }
  while( true ) {
    LOCK();
    sVar1 = ctx->job_lk;
    ctx->job_lk = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (ctx->job_lk != 0);
  }
  psVar12 = ctx->job_pool->pages;
  if (psVar12 != (sx__pool_page *)0x0) {
    do {
      if ((int)uVar25 <= psVar12->iter) {
        if (0 < (int)uVar25) {
          uVar18 = 0;
          iVar2 = (uint)(0 < (int)local_64) + iVar8;
          range_start = 0;
          do {
            range_end = iVar2;
            psVar15 = sx__new_job(ctx,uVar18,callback,user,range_start,range_end,puVar10,tags,
                                  priority);
            if (ctx->waiting_list_last[priority] != (sx__job *)0x0) {
              ctx->waiting_list_last[priority]->next = psVar15;
              psVar15->prev = ctx->waiting_list_last[priority];
            }
            ctx->waiting_list_last[priority] = psVar15;
            if (ctx->waiting_list[priority] == (sx__job *)0x0) {
              ctx->waiting_list[priority] = psVar15;
            }
            bVar5 = 1 < (int)local_64;
            uVar18 = uVar18 + 1;
            local_64 = local_64 - 1;
            iVar2 = (uint)bVar5 + iVar8 + range_end;
            range_start = range_end;
          } while (uVar25 != uVar18);
        }
        if (1 < (int)local_64) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                            ,0x158,"range_reminder <= 0");
          pcVar6 = (code *)swi(3);
          puVar10 = (sx_job_t)(*pcVar6)();
          return puVar10;
        }
        sx_semaphore_post(&ctx->sem,uVar25);
        goto LAB_0010ab39;
      }
      psVar12 = psVar12->next;
    } while (psVar12 != (sx__pool_page *)0x0);
  }
  psVar27 = ctx->pending;
  if (psVar27 == (sx__job_pending *)0x0) {
    uVar9 = 1;
    uVar20 = 0;
LAB_0010aa82:
    if ((int)uVar9 < (int)uVar20) {
      uVar9 = uVar20;
    }
    uVar28 = 8;
    if (8 < (int)uVar9) {
      uVar28 = (ulong)uVar9;
    }
    psVar23 = &psVar27[-1].priority;
    if (psVar27 == (sx__job_pending *)0x0) {
      psVar23 = (sx_job_priority *)0x0;
    }
    sVar22 = uVar28 * 0x28 + 8;
    pcVar19 = "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c";
    uVar25 = 0x10f000;
    uVar26 = 0x166;
    puVar16 = (undefined4 *)
              (*ctx->alloc->alloc_cb)
                        (psVar23,sVar22,0,
                         "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                         "sx_job_dispatch",0x166,ctx->alloc->user_data);
    uVar18 = (uint32_t)sVar22;
    if (puVar16 == (undefined4 *)0x0) {
      sx_job_dispatch_cold_1();
      plVar11 = *(long **)(*(long *)(psVar23 + 6) + 8);
      do {
        iVar8 = (int)plVar11[3];
        if (iVar8 != 0) {
          if (0 < iVar8) {
            *(uint *)(plVar11 + 3) = iVar8 - 1U;
            puVar10 = *(sx_job_t *)(*plVar11 + (ulong)(iVar8 - 1U) * 8);
            if (puVar10 == (sx_job_t)0x0) {
              puVar10 = (sx_job_t)0x0;
            }
            else {
              *puVar10 = uVar18;
              puVar10[3] = in_stack_ffffffffffffff88;
              puVar10[1] = 0;
              puVar10[2] = 0;
              pvVar24 = *(void **)(puVar10 + 4);
              if (pvVar24 == (void *)0x0) {
                _Var7 = sx_fiber_stack_init((sx_fiber_stack *)(puVar10 + 4),psVar23[5]);
                if (!_Var7) {
                  sourcefile = 
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c";
                  sx__mem_run_fail_callback
                            ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                             ,0x81);
                  pcVar19 = "Out of memory";
                  uVar18 = 0x81;
                  goto LAB_0010ac38;
                }
                pvVar24 = ((sx_fiber_stack *)(puVar10 + 4))->sptr;
              }
              stack.ssize = puVar10[6];
              stack.sptr = pvVar24;
              stack._12_4_ = 0;
              pvVar17 = sx_fiber_create(stack,fiber_fn);
              *(sx_fiber_t *)(puVar10 + 8) = pvVar17;
              *(ulong *)(puVar10 + 0xc) = CONCAT44(uStack_7c,in_stack_ffffffffffffff80);
              *(sx_job_priority **)(puVar10 + 0xe) = psVar23 + 0x34;
              *(sx_job_priority **)(puVar10 + 0x10) = psVar23;
              *(undefined8 *)(puVar10 + 0x12) = extraout_RDX;
              *(char **)(puVar10 + 0x14) = pcVar19;
              puVar10[0x16] = uVar25;
              puVar10[0x17] = uVar26;
              puVar10[0x18] = uStack_70;
              puVar10[0x1a] = 0;
              puVar10[0x1b] = 0;
              puVar10[0x1c] = 0;
              puVar10[0x1d] = 0;
            }
            return puVar10;
          }
          break;
        }
        plVar11 = (long *)plVar11[2];
      } while (plVar11 != (long *)0x0);
      sourcefile = "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
      ;
      pcVar19 = "capacity is full";
      uVar18 = 0x8f;
LAB_0010ac38:
      sx__debug_message(sourcefile,uVar18,pcVar19);
      pcVar6 = (code *)swi(3);
      puVar10 = (sx_job_t)(*pcVar6)();
      return puVar10;
    }
    *puVar16 = (int)uVar28;
    if (psVar27 == (sx__job_pending *)0x0) {
      puVar16[1] = 0;
    }
    psVar27 = (sx__job_pending *)(puVar16 + 2);
    ctx->pending = psVar27;
    uVar18 = puVar16[1];
    uVar9 = uVar18 + 1;
  }
  else {
    uVar18 = psVar27[-1].tags;
    uVar9 = uVar18 + 1;
    if ((int)psVar27[-1].priority <= (int)uVar9) {
      uVar20 = psVar27[-1].priority * 2;
      goto LAB_0010aa82;
    }
  }
  psVar27[-1].tags = uVar9;
  psVar27[(int)uVar18].counter = puVar10;
  psVar27[(int)uVar18].range_size = iVar8;
  psVar27[(int)uVar18].range_reminder = local_64;
  psVar27[(int)uVar18].callback = callback;
  psVar27[(int)uVar18].user = user;
  psVar27[(int)uVar18].priority = priority;
  psVar27[(int)uVar18].tags = tags;
LAB_0010ab39:
  ctx->job_lk = 0;
  return puVar10;
}

Assistant:

sx_job_t sx_job_dispatch(sx_job_context* ctx, int count, sx_job_cb* callback, void* user,
                         sx_job_priority priority, unsigned int tags)
{
    sx_assert(count > 0);

    sx__job_thread_data* tdata = (sx__job_thread_data*)sx_tls_get(ctx->thread_tls);

    // Divide job count into ranges
    // check which threads are eligible to execute this task (based on tags)
    int num_workers = 0;
    if (tags != 0) {
        for (int i = 0, ic = ctx->num_threads + 1; i < ic; i++) {
            if (ctx->tags[i] & tags)
                num_workers++;
        }
    } else {
        num_workers = ctx->num_threads + 1;
    }

    int range_size = count / num_workers;
    int range_reminder = count % num_workers;
    int num_jobs = range_size > 0 ? num_workers : (range_reminder > 0 ? range_reminder : 0);
    sx_assert(num_jobs > 0);
    sx_assertf(num_jobs <= ctx->job_pool->capacity,
              "this amount of jobs at a time cannot be done. increase max_jobs");

    // Create a counter (job handle)
    sx_job_t counter;
    sx_lock(ctx->counter_lk) {
        counter = (sx_job_t)sx_pool_new_and_grow(ctx->counter_pool, ctx->alloc);
    }

    if (!counter) {
        sx_assertf(0, "Maximum job instances exceeded");
        return NULL;
    }

    sx_atomic_store32_explicit(counter, (uint32_t)num_jobs, SX_ATOMIC_MEMORYORDER_RELEASE);
    sx_assertf(tdata, "Dispatch must be called within main thread or job threads");

    // Another job is running on this thread. So depend the current running job to the new
    // dispatches
    if (tdata->cur_job)
        tdata->cur_job->wait_counter = counter;

    // Push jobs to the end of the list, so they can be collected by threads
    sx_lock(ctx->job_lk) {
        if (!sx_pool_fulln(ctx->job_pool, num_jobs)) {
            int range_start = 0;
            int range_end = range_size + (range_reminder > 0 ? 1 : 0);
            --range_reminder;

            for (int i = 0; i < num_jobs; i++) {
                sx__job_add_list(&ctx->waiting_list[priority], &ctx->waiting_list_last[priority],
                                 sx__new_job(ctx, i, callback, user, range_start, range_end, counter,
                                             tags, priority));
                range_start = range_end;
                range_end += (range_size + (range_reminder > 0 ? 1 : 0));
                --range_reminder;
            }
            sx_assert(range_reminder <= 0);

            // Post to semaphore to worker threads start cur_job
            sx_semaphore_post(&ctx->sem, num_jobs);
        } else {
            SX_PRAGMA_DIAGNOSTIC_PUSH()
            SX_PRAGMA_DIAGNOSTIC_IGNORED_MSVC(4204)     // nonstandard extension used: non-constant aggregate initializer
            sx__job_pending pending = { .counter = counter,
                                        .range_size = range_size,
                                        .range_reminder = range_reminder,
                                        .callback = callback,
                                        .user = user,
                                        .priority = priority,
                                        .tags = tags };
            sx_array_push(ctx->alloc, ctx->pending, pending);
            SX_PRAGMA_DIAGNOSTIC_POP()   
        }
    }   // lock

    return counter;
}